

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

TimingCheckArgSyntax * __thiscall slang::parsing::Parser::parseTimingCheckArg(Parser *this)

{
  bool bVar1;
  int iVar2;
  EmptyTimingCheckArgSyntax *pEVar3;
  SourceLocation SVar4;
  ExpressionTimingCheckArgSyntax *pEVar5;
  EdgeDescriptorSyntax *pEVar6;
  undefined4 extraout_var;
  EdgeControlSpecifierSyntax *controlSpecifier;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar8;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar9;
  Diagnostic *pDVar10;
  NameSyntax *expr;
  ExpressionSyntax *pEVar11;
  TimingCheckEventConditionSyntax *condition;
  TimingCheckEventArgSyntax *pTVar12;
  Info *extraout_RDX;
  Info *extraout_RDX_00;
  Info *extraout_RDX_01;
  Info *extraout_RDX_02;
  Info *pIVar13;
  Info *extraout_RDX_03;
  Info *extraout_RDX_04;
  TokenKind TVar14;
  Token edge_00;
  Token TVar15;
  SourceRange SVar16;
  string_view arg;
  Token closeBracket;
  Token edge;
  Token openBracket;
  Token local_230;
  Token local_220;
  Token local_210;
  Token local_200;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_1f0;
  undefined1 local_1e0;
  Token local_1d8;
  undefined1 local_1c8 [8];
  Info *pIStack_1c0;
  SyntaxNode *local_1b8;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> _Stack_1b0;
  pointer local_1a0;
  __extent_storage<18446744073709551615UL> local_198;
  pointer pTVar7;
  
  bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
  if (bVar1) {
LAB_001eb783:
    TVar15 = ParserBase::placeholderToken(&this->super_ParserBase);
    pEVar3 = syntax::SyntaxFactory::emptyTimingCheckArg(&this->factory,TVar15);
    return &pEVar3->super_TimingCheckArgSyntax;
  }
  bVar1 = ParserBase::peek(&this->super_ParserBase,CloseParenthesis);
  if (bVar1) goto LAB_001eb783;
  local_210 = parseEdgeKeyword(this);
  if (local_210.info == (Info *)0x0) {
    condition = (TimingCheckEventConditionSyntax *)0x0;
    expr = (NameSyntax *)
           parseMinTypMaxExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0);
    bVar1 = ParserBase::peek(&this->super_ParserBase,TripleAnd);
    if (bVar1) {
      TVar15 = ParserBase::consume(&this->super_ParserBase);
      pEVar11 = parseExpression(this);
      condition = syntax::SyntaxFactory::timingCheckEventCondition(&this->factory,TVar15,pEVar11);
    }
    if (condition == (TimingCheckEventConditionSyntax *)0x0) {
      pEVar5 = syntax::SyntaxFactory::expressionTimingCheckArg
                         (&this->factory,(ExpressionSyntax *)expr);
      return &pEVar5->super_TimingCheckArgSyntax;
    }
    Token::Token(&local_1d8);
    controlSpecifier = (EdgeControlSpecifierSyntax *)0x0;
    goto LAB_001ebc6a;
  }
  bVar1 = ParserBase::peek(&this->super_ParserBase,OpenBracket);
  if (bVar1) {
    Token::Token(&local_200);
    Token::Token(&local_230);
    local_200 = ParserBase::expect(&this->super_ParserBase,OpenBracket);
    if (((undefined1  [16])local_200 & (undefined1  [16])0x10000) == (undefined1  [16])0x0) {
      local_1c8 = (undefined1  [8])&_Stack_1b0;
      pIStack_1c0 = (Info *)0x0;
      local_1b8 = (SyntaxNode *)0x10;
      local_220 = ParserBase::peek(&this->super_ParserBase);
      bVar1 = syntax::SyntaxFacts::isEndOfBracketedList(local_220.kind);
      if (bVar1) {
        bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
        if (!bVar1) {
          SVar4 = Token::location(&local_220);
          ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x3a0005,SVar4);
        }
        local_230 = ParserBase::expect(&this->super_ParserBase,CloseBracket);
LAB_001eb939:
        pIVar13 = local_230.info;
      }
      else {
        bVar1 = syntax::SyntaxFacts::isPossibleEdgeDescriptor(local_220.kind);
        if (bVar1) {
          do {
            pEVar6 = parseEdgeDescriptor(this);
            local_1f0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pEVar6;
            local_1e0 = 1;
            SmallVectorBase<slang::syntax::TokenOrSyntax>::
            emplace_back<slang::syntax::TokenOrSyntax>
                      ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                       (TokenOrSyntax *)&local_1f0._M_first);
            TVar15 = ParserBase::peek(&this->super_ParserBase);
            TVar14 = TVar15.kind;
            bVar1 = syntax::SyntaxFacts::isEndOfBracketedList(TVar14);
            iVar2 = 3;
            pIVar13 = extraout_RDX;
            if (TVar14 != EndOfFile && !bVar1) {
              if (TVar14 != Comma) {
                ParserBase::expect(&this->super_ParserBase,Comma);
                do {
                  bVar1 = ParserBase::
                          skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleEdgeDescriptor,&slang::syntax::SyntaxFacts::isEndOfBracketedList>
                                    (&this->super_ParserBase,(DiagCode)0x3a0005,false);
                  if (!bVar1) {
                    local_230 = ParserBase::expect(&this->super_ParserBase,CloseBracket);
                    pIVar13 = local_230.info;
                    iVar2 = 1;
                    goto LAB_001ebaa7;
                  }
                  bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
                } while (!bVar1);
              }
              local_1f0._M_first._M_storage =
                   (_Uninitialized<slang::parsing::Token,_true>)
                   ParserBase::expect(&this->super_ParserBase,Comma);
              local_1e0 = 0;
              SmallVectorBase<slang::syntax::TokenOrSyntax>::
              emplace_back<slang::syntax::TokenOrSyntax>
                        ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                         (TokenOrSyntax *)&local_1f0._M_first);
              TVar15 = ParserBase::peek(&this->super_ParserBase);
              TVar14 = TVar15.kind;
              bVar1 = syntax::SyntaxFacts::isEndOfBracketedList(TVar14);
              if (TVar14 == EndOfFile || bVar1) {
                ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
                pIVar13 = extraout_RDX_01;
              }
              else {
                pIVar13 = extraout_RDX_00;
                if ((local_220.kind == TVar14) && (local_220.info == TVar15.info)) {
                  bVar1 = ParserBase::
                          skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleEdgeDescriptor,&slang::syntax::SyntaxFacts::isEndOfBracketedList>
                                    (&this->super_ParserBase,(DiagCode)0x3a0005,true);
                  pIVar13 = extraout_RDX_02;
                  if (!bVar1) goto LAB_001ebaa7;
                }
                iVar2 = 0;
                local_220 = TVar15;
              }
            }
LAB_001ebaa7:
          } while (iVar2 == 0);
          if (iVar2 == 3) {
            local_230 = ParserBase::expect(&this->super_ParserBase,CloseBracket);
            goto LAB_001eb939;
          }
        }
        else {
          ParserBase::reportMissingList
                    (&this->super_ParserBase,local_220,CloseBracket,&local_230,(DiagCode)0x3a0005);
          pIVar13 = extraout_RDX_03;
        }
      }
      iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                        ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                         (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)pIVar13);
      pTVar7 = (pointer)CONCAT44(extraout_var,iVar2);
      pIVar13 = extraout_RDX_04;
      if (local_1c8 != (undefined1  [8])&_Stack_1b0) {
        operator_delete((void *)local_1c8);
      }
    }
    else {
      SVar4 = Token::location(&local_200);
      local_230 = ParserBase::missingToken(&this->super_ParserBase,CloseBracket,SVar4);
      pIVar13 = (Info *)0x0;
      pTVar7 = (pointer)0x0;
    }
    pIStack_1c0 = (Info *)CONCAT44(pIStack_1c0._4_4_,3);
    local_1b8 = (SyntaxNode *)0x0;
    _Stack_1b0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)0x0;
    local_1c8 = (undefined1  [8])&PTR_getChild_002f91a8;
    _Stack_1b0._M_first._M_storage.info = pIVar13;
    local_1a0 = pTVar7;
    local_198._M_extent_value = (size_t)pIVar13;
    controlSpecifier =
         syntax::SyntaxFactory::edgeControlSpecifier
                   (&this->factory,local_200,
                    (SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax> *)local_1c8,local_230)
    ;
    if ((Info *)0xb < pIVar13) {
      if (*(__index_type *)
           ((long)&pTVar7[0xb].super_ConstTokenOrSyntax.
                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                   .
                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                   .super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                   .super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
           + 0x10) == '\x01') {
        ppSVar8 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                            ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                             (pTVar7 + 0xb));
        SVar16 = syntax::SyntaxNode::sourceRange(*ppSVar8);
      }
      else {
        pvVar9 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                           ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                            (pTVar7 + 0xb));
        local_1c8 = *(undefined1 (*) [8])pvVar9;
        pIStack_1c0 = pvVar9->info;
        SVar16 = Token::range((Token *)local_1c8);
      }
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xa90005,SVar16);
    }
    if (local_210.kind != EdgeKeyword) {
      SVar16 = Token::range(&local_210);
      pDVar10 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x280005,SVar16);
      arg = Token::valueText(&local_210);
      pDVar10 = Diagnostic::operator<<(pDVar10,arg);
      SVar16 = syntax::SyntaxNode::sourceRange(&controlSpecifier->super_SyntaxNode);
      Diagnostic::operator<<(pDVar10,SVar16);
    }
  }
  else {
    controlSpecifier = (EdgeControlSpecifierSyntax *)0x0;
  }
  expr = parseName(this);
  bVar1 = ParserBase::peek(&this->super_ParserBase,TripleAnd);
  if (bVar1) {
    TVar15 = ParserBase::consume(&this->super_ParserBase);
    pEVar11 = parseExpression(this);
    condition = syntax::SyntaxFactory::timingCheckEventCondition(&this->factory,TVar15,pEVar11);
  }
  else {
    condition = (TimingCheckEventConditionSyntax *)0x0;
  }
  local_1d8.info = local_210.info;
  local_1d8._0_8_ = local_210._0_8_;
LAB_001ebc6a:
  edge_00.info = local_1d8.info;
  edge_00.kind = local_1d8.kind;
  edge_00._2_1_ = local_1d8._2_1_;
  edge_00.numFlags.raw = local_1d8.numFlags.raw;
  edge_00.rawLen = local_1d8.rawLen;
  pTVar12 = syntax::SyntaxFactory::timingCheckEventArg
                      (&this->factory,edge_00,controlSpecifier,&expr->super_ExpressionSyntax,
                       condition);
  return &pTVar12->super_TimingCheckArgSyntax;
}

Assistant:

TimingCheckArgSyntax& Parser::parseTimingCheckArg() {
    if (peek(TokenKind::Comma) || peek(TokenKind::CloseParenthesis))
        return factory.emptyTimingCheckArg(placeholderToken());

    auto parseCondition = [&]() -> TimingCheckEventConditionSyntax* {
        if (!peek(TokenKind::TripleAnd))
            return nullptr;

        // The syntax in the BNF for condition expressions is nonsensical,
        // and there is some discussion in the Mantis tracker about how it's
        // a holdover from Verilog-XL and should likely be replaced with just
        // a plain old expression, so that's what we're doing here.
        auto tripleAnd = consume();
        auto& expr = parseExpression();
        return &factory.timingCheckEventCondition(tripleAnd, expr);
    };

    auto edge = parseEdgeKeyword();
    if (edge) {
        EdgeControlSpecifierSyntax* control = nullptr;
        if (peek(TokenKind::OpenBracket)) {
            Token openBracket, closeBracket;
            std::span<TokenOrSyntax> list;
            parseList<isPossibleEdgeDescriptor, isEndOfBracketedList>(
                TokenKind::OpenBracket, TokenKind::CloseBracket, TokenKind::Comma, openBracket,
                list, closeBracket, RequireItems::True, diag::ExpectedEdgeDescriptor,
                [this] { return &parseEdgeDescriptor(); });

            control = &factory.edgeControlSpecifier(openBracket, list, closeBracket);

            // List is allowed to have up to 6 specifiers (plus 5 commas)
            if (list.size() > 11) {
                auto& lastDesc = list[11];
                auto range = lastDesc.isNode() ? lastDesc.node()->sourceRange()
                                               : lastDesc.token().range();
                addDiag(diag::TooManyEdgeDescriptors, range);
            }

            if (edge.kind != TokenKind::EdgeKeyword) {
                addDiag(diag::EdgeDescWrongKeyword, edge.range())
                    << edge.valueText() << control->sourceRange();
            }
        }

        auto& terminal = parseName();
        auto cond = parseCondition();
        return factory.timingCheckEventArg(edge, control, terminal, cond);
    }

    auto& expr = parseMinTypMaxExpression();
    auto cond = parseCondition();
    if (cond)
        return factory.timingCheckEventArg(Token(), nullptr, expr, cond);

    else
        return factory.expressionTimingCheckArg(expr);
}